

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromEquirectangular<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  CubemapFace<float> *pCVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float local_98;
  float local_94;
  CubemapFace<float> **local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  float vec [3];
  
  local_80 = _height + 1 >> 1;
  local_68 = local_80 & 0xffffffff;
  fVar10 = (float)local_68;
  local_78 = local_80 * 3;
  local_88 = local_80 * local_80 * 0xc & 0x3fffffffc;
  local_48 = local_68 * 3;
  lVar6 = 0;
  local_90 = _faces;
  local_58 = _width;
  local_50 = _channels;
  while (lVar6 != 6) {
    pCVar1 = (CubemapFace<float> *)operator_new(0x18);
    pCVar1->data = (float *)0x0;
    pCVar1->id = 0;
    pCVar1->width = 0;
    pCVar1->height = 0;
    pCVar1->currentOffset = 0;
    local_90[lVar6] = pCVar1;
    pCVar1->id = (int)lVar6;
    pfVar2 = (float *)operator_new__(local_88);
    pCVar1->data = pfVar2;
    pCVar1->width = (int)local_80;
    pCVar1->height = (int)local_80;
    pCVar1->currentOffset = 0;
    uVar4 = 0;
    local_70 = lVar6;
    while (uVar4 != local_68) {
      uVar8 = (int)local_78 * (int)uVar4;
      pfVar2 = local_90[local_70]->data;
      uVar9 = 0;
      local_60 = uVar4;
      for (uVar5 = 0; local_48 != uVar5; uVar5 = uVar5 + 3) {
        uVar7 = uVar5 & 0xffffffff;
        texelCoordToVec(vec,((float)uVar9 + (float)uVar9) * (1.0 / fVar10) + -1.0,
                        ((float)(uVar4 & 0xffffffff) + (float)(uVar4 & 0xffffffff)) * (1.0 / fVar10)
                        + -1.0,(uint8_t)lVar6);
        latLongFromVec(&local_94,&local_98,vec);
        lVar3 = ((ulong)(uint)(int)(local_94 * (float)((int)_width + -1)) +
                (uint)(int)(local_98 * (float)((int)_height + -1)) * local_58) * local_50;
        pfVar2[uVar8 + uVar7] = _data[lVar3];
        pfVar2[(ulong)uVar8 + uVar7 + 1] = _data[lVar3 + 1];
        pfVar2[(ulong)uVar8 + uVar7 + 2] = _data[lVar3 + 2];
        uVar9 = uVar9 + 1;
      }
      uVar4 = local_60 + 1;
    }
    lVar6 = local_70 + 1;
  }
  return;
}

Assistant:

void splitFacesFromEquirectangular(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    // Alloc data.
    const uint32_t faceWidth = (_height + 1)/2;
    const uint32_t faceHeight = faceWidth;

    // Get source parameters.
    const float srcWidthMinusOne  = float(int(_width-1));
    const float srcHeightMinusOne = float(int(_height-1));
    const float invfaceWidthf = 1.0f/float(faceWidth);

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;

        for (uint32_t yy = 0; yy < faceHeight; ++yy) {
            T* dstRowData = &_faces[i]->data[yy * faceWidth * 3];

            for (uint32_t xx = 0; xx < faceWidth; ++xx) {
                T* dstColumnData = &dstRowData[xx * 3];

                // Cubemap (u,v) on current face.
                const float uu = 2.0f*xx*invfaceWidthf-1.0f;
                const float vv = 2.0f*yy*invfaceWidthf-1.0f;

                // Get cubemap vector (x,y,z) from (u,v,faceIdx).
                float vec[3];
                texelCoordToVec(vec, uu, vv, i);

                // Convert cubemap vector (x,y,z) to latlong (u,v).
                float xSrcf;
                float ySrcf;
                latLongFromVec(xSrcf, ySrcf, vec);

                // Convert from [0..1] to [0..(size-1)] range.
                xSrcf *= srcWidthMinusOne;
                ySrcf *= srcHeightMinusOne;

                // Sample from latlong (u,v).
                #ifdef USE_BILINEAR_INTERPOLATION
                    const uint32_t x0 = ftou(xSrcf);
                    const uint32_t y0 = ftou(ySrcf);
                    const uint32_t x1 = M_MIN(x0+1, _width-1);
                    const uint32_t y1 = M_MIN(y0+1, _height-1);

                    const T *src0 = &_data[y0 * _width * _channels + x0 * _channels];
                    const T *src1 = &_data[y0 * _width * _channels + x1 * _channels];
                    const T *src2 = &_data[y1 * _width * _channels + x0 * _channels];
                    const T *src3 = &_data[y1 * _width * _channels + x1 * _channels];

                    const float tx = xSrcf - float(int(x0));
                    const float ty = ySrcf - float(int(y0));
                    const float invTx = 1.0f - tx;
                    const float invTy = 1.0f - ty;

                    T p0[3];
                    T p1[3];
                    T p2[3];
                    T p3[3];
                    vec3Mul(p0, src0, invTx*invTy);
                    vec3Mul(p1, src1,    tx*invTy);
                    vec3Mul(p2, src2, invTx*   ty);
                    vec3Mul(p3, src3,    tx*   ty);

                    const T rr = p0[0] + p1[0] + p2[0] + p3[0];
                    const T gg = p0[1] + p1[1] + p2[1] + p3[1];
                    const T bb = p0[2] + p1[2] + p2[2] + p3[2];

                    dstColumnData[0] = rr;
                    dstColumnData[1] = gg;
                    dstColumnData[2] = bb;
                #else
                    const uint32_t xSrc = ftou(xSrcf);
                    const uint32_t ySrc = ftou(ySrcf);

                    dstColumnData[0] = _data[ySrc * _width * _channels + xSrc * _channels + 0];
                    dstColumnData[1] = _data[ySrc * _width * _channels + xSrc * _channels + 1];
                    dstColumnData[2] = _data[ySrc * _width * _channels + xSrc * _channels + 2];
                #endif
            }
        }
    }
}